

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utBlendImportAreaLight.cpp
# Opt level: O2

void __thiscall
BlendImportAreaLight_testImportLight_Test::TestBody(BlendImportAreaLight_testImportLight_Test *this)

{
  aiScene *paVar1;
  char *pcVar2;
  char *in_R9;
  size_t i;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  AssertHelper local_98;
  AssertHelper local_90;
  AssertionResult gtest_ar;
  vector<aiLight,_std::allocator<aiLight>_> lights;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  lightNames;
  
  paVar1 = Assimp::Importer::ReadFile
                     ((this->super_BlendImportAreaLight).im,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/BLEND/AreaLight_269.blend"
                      ,0x400);
  lightNames.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lightNames.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(lightNames.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,paVar1 != (aiScene *)0x0);
  if (paVar1 == (aiScene *)0x0) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&lights,(internal *)&lightNames,(AssertionResult *)"pTest != NULL","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
               ,0x49,(char *)lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&gtest_ar);
LAB_00378be5:
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&lights);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&lightNames.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&lightNames.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  bVar6 = paVar1->mLights != (aiLight **)0x0;
  bVar7 = paVar1->mNumLights != 0;
  lightNames.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(lightNames.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar7 && bVar6);
  lightNames.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!bVar7 || !bVar6) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&lights,(internal *)&lightNames,(AssertionResult *)"pTest->HasLights()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
               ,0x4a,(char *)lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&gtest_ar);
    goto LAB_00378be5;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&lightNames.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  lightNames.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lightNames.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lightNames.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pbVar4 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)paVar1->mNumLights;
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pbVar4->_M_dataplus)._M_p + 1)) {
    gtest_ar._0_8_ = (paVar1->mLights[(long)pbVar4]->mName).data;
    gtest_ar.message_.ptr_ = pbVar4;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_*,_unsigned_long,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)&lights,(pair<const_char_*,_unsigned_long> *)&gtest_ar);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
    ::emplace_back<std::pair<std::__cxx11::string,unsigned_long>>
              ((vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
                *)&lightNames,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)&lights);
    std::__cxx11::string::~string((string *)&lights);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (lightNames.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             lightNames.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  lVar5 = 0x20;
  for (uVar3 = 0; uVar3 < paVar1->mNumLights; uVar3 = uVar3 + 1) {
    std::vector<aiLight,_std::allocator<aiLight>_>::push_back
              (&lights,paVar1->mLights
                       [*(long *)((long)&((lightNames.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->first).
                                         _M_dataplus._M_p + lVar5)]);
    lVar5 = lVar5 + 0x28;
  }
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"lights[0].mName.C_Str()","\"Bar\"",
             ((lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
               super__Vector_impl_data._M_start)->mName).data,"Bar");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"lights[1].mName.C_Str()","\"Baz\"",
               lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
               super__Vector_impl_data._M_start[1].mName.data,"Baz");
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_98);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                 ,0x5b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"lights[2].mName.C_Str()","\"Foo\"",
                 lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                 super__Vector_impl_data._M_start[2].mName.data,"Foo");
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_98);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                   ,0x5c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_98.data_._0_4_ = 5;
        testing::internal::CmpHelperEQ<aiLightSourceType,aiLightSourceType>
                  ((internal *)&gtest_ar,"lights[0].mType","aiLightSource_AREA",
                   &(lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                     super__Vector_impl_data._M_start)->mType,(aiLightSourceType *)&local_98);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_98);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                     ,0x5e,pcVar2);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          local_98.data_._0_4_ = 2;
          testing::internal::CmpHelperEQ<aiLightSourceType,aiLightSourceType>
                    ((internal *)&gtest_ar,"lights[1].mType","aiLightSource_POINT",
                     &lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                      super__Vector_impl_data._M_start[1].mType,(aiLightSourceType *)&local_98);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_98);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_90,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                       ,0x5f,pcVar2);
            testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            local_98.data_._0_4_ = 5;
            testing::internal::CmpHelperEQ<aiLightSourceType,aiLightSourceType>
                      ((internal *)&gtest_ar,"lights[2].mType","aiLightSource_AREA",
                       &lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                        super__Vector_impl_data._M_start[2].mType,(aiLightSourceType *)&local_98);
            if (gtest_ar.success_ != false) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[0].mSize.x","0.5f",
                         ((lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                           super__Vector_impl_data._M_start)->mSize).x,0.5);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x62,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[0].mSize.y","2.0f",
                         ((lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                           super__Vector_impl_data._M_start)->mSize).y,2.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,99,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[2].mSize.x","1.0f",
                         lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                         super__Vector_impl_data._M_start[2].mSize.x,1.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,100,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[2].mSize.y","1.0f",
                         lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                         super__Vector_impl_data._M_start[2].mSize.y,1.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x65,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[0].mColorDiffuse.r","42.0f",
                         ((lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                           super__Vector_impl_data._M_start)->mColorDiffuse).r,42.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x67,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[0].mColorDiffuse.g","42.0f",
                         ((lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                           super__Vector_impl_data._M_start)->mColorDiffuse).g,42.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x68,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[0].mColorDiffuse.b","42.0f",
                         ((lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                           super__Vector_impl_data._M_start)->mColorDiffuse).b,42.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x69,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[2].mColorDiffuse.r","1.0f",
                         lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                         super__Vector_impl_data._M_start[2].mColorDiffuse.r,1.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x6a,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[2].mColorDiffuse.g","1.0f",
                         lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                         super__Vector_impl_data._M_start[2].mColorDiffuse.g,1.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x6b,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[2].mColorDiffuse.b","1.0f",
                         lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                         super__Vector_impl_data._M_start[2].mColorDiffuse.b,1.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x6c,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[0].mDirection.x","0.0f",
                         ((lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                           super__Vector_impl_data._M_start)->mDirection).x,0.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x6e,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[0].mDirection.y","0.0f",
                         ((lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                           super__Vector_impl_data._M_start)->mDirection).y,0.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x6f,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[0].mDirection.z","-1.0f",
                         ((lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                           super__Vector_impl_data._M_start)->mDirection).z,-1.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x70,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[2].mDirection.x","0.0f",
                         lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                         super__Vector_impl_data._M_start[2].mDirection.x,0.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x71,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[2].mDirection.y","0.0f",
                         lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                         super__Vector_impl_data._M_start[2].mDirection.y,0.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x72,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)&gtest_ar,"lights[2].mDirection.z","-1.0f",
                         lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>._M_impl.
                         super__Vector_impl_data._M_start[2].mDirection.z,-1.0);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_98);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                           ,0x73,pcVar2);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_98);
              }
              goto LAB_00378fea;
            }
            testing::Message::Message((Message *)&local_98);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_90,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utBlendImportAreaLight.cpp"
                       ,0x60,pcVar2);
            testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_98);
LAB_00378fea:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<aiLight,_std::allocator<aiLight>_>::~_Vector_base
            (&lights.super__Vector_base<aiLight,_std::allocator<aiLight>_>);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~vector(&lightNames);
  return;
}

Assistant:

TEST_F(BlendImportAreaLight, testImportLight)
{
    const aiScene* pTest = im->ReadFile(ASSIMP_TEST_MODELS_DIR "/BLEND/AreaLight_269.blend", aiProcess_ValidateDataStructure);
    ASSERT_TRUE(pTest != NULL);
    ASSERT_TRUE(pTest->HasLights());

    std::vector< std::pair<std::string, size_t> > lightNames;

    for (size_t i = 0; i < pTest->mNumLights; i++) {
        lightNames.push_back(std::make_pair(pTest->mLights[i]->mName.C_Str(), i));
    }

    std::sort(lightNames.begin(), lightNames.end());

    std::vector<aiLight> lights;

    for (size_t i = 0; i < pTest->mNumLights; ++i) {
        lights.push_back(*pTest->mLights[lightNames[i].second]);
    }

    ASSERT_STREQ(lights[0].mName.C_Str(), "Bar");
    ASSERT_STREQ(lights[1].mName.C_Str(), "Baz");
    ASSERT_STREQ(lights[2].mName.C_Str(), "Foo");

    ASSERT_EQ(lights[0].mType, aiLightSource_AREA);
    ASSERT_EQ(lights[1].mType, aiLightSource_POINT);
    ASSERT_EQ(lights[2].mType, aiLightSource_AREA);

    EXPECT_FLOAT_EQ(lights[0].mSize.x, 0.5f);
    EXPECT_FLOAT_EQ(lights[0].mSize.y, 2.0f);
    EXPECT_FLOAT_EQ(lights[2].mSize.x, 1.0f);
    EXPECT_FLOAT_EQ(lights[2].mSize.y, 1.0f);

    EXPECT_FLOAT_EQ(lights[0].mColorDiffuse.r, 42.0f);
    EXPECT_FLOAT_EQ(lights[0].mColorDiffuse.g, 42.0f);
    EXPECT_FLOAT_EQ(lights[0].mColorDiffuse.b, 42.0f);
    EXPECT_FLOAT_EQ(lights[2].mColorDiffuse.r, 1.0f);
    EXPECT_FLOAT_EQ(lights[2].mColorDiffuse.g, 1.0f);
    EXPECT_FLOAT_EQ(lights[2].mColorDiffuse.b, 1.0f);

    EXPECT_FLOAT_EQ(lights[0].mDirection.x, 0.0f);
    EXPECT_FLOAT_EQ(lights[0].mDirection.y, 0.0f);
    EXPECT_FLOAT_EQ(lights[0].mDirection.z, -1.0f);
    EXPECT_FLOAT_EQ(lights[2].mDirection.x, 0.0f);
    EXPECT_FLOAT_EQ(lights[2].mDirection.y, 0.0f);
    EXPECT_FLOAT_EQ(lights[2].mDirection.z, -1.0f);
}